

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbits.cpp
# Opt level: O0

void testpercents(wins *wins_ar,int ar_len)

{
  Am_Drawonable *pAVar1;
  undefined4 uVar2;
  Am_Image_Array local_78 [8];
  Am_Style local_70 [8];
  Am_Style my_diamond_fill;
  Am_Image_Array my_diamond_image;
  int top;
  int left;
  Am_Image_Array local_48 [8];
  Am_Style local_40 [8];
  Am_Style image_style;
  Am_Image_Array image_array;
  int local_2c;
  int local_28;
  int n;
  int final_top;
  int final_left;
  Am_Drawonable *d;
  int i;
  int ar_len_local;
  wins *wins_ar_local;
  
  for (d._0_4_ = 0; (int)d < ar_len; d._0_4_ = (int)d + 1) {
    pAVar1 = wins_ar[(int)d].d2;
    n = 0;
    local_28 = 0;
    for (local_2c = 0; local_2c < 100; local_2c = local_2c + 6) {
      Am_Image_Array::Am_Image_Array((Am_Image_Array *)&image_style,local_2c);
      Am_Image_Array::Am_Image_Array(local_48,(Am_Image_Array *)&image_style);
      uVar2 = 0;
      Am_Style::Am_Style(local_40,"red",8,1,0,1,&Am_DEFAULT_DASH_LIST,2,2,0,local_48);
      Am_Image_Array::~Am_Image_Array(local_48);
      n = (local_2c / 6) * 0x1e + ((local_2c / 6) / 3) * -0x5a + 10;
      local_28 = (local_2c / 0x12) * 0x1d + 8;
      (**(code **)(*(long *)pAVar1 + 0x160))
                (pAVar1,&Am_No_Style,local_40,n,local_28,0x19,CONCAT44(uVar2,0x19),0);
      Am_Style::~Am_Style(local_40);
      Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&image_style);
    }
    Am_Image_Array::Am_Image_Array
              ((Am_Image_Array *)&my_diamond_fill,testpercents::my_diamond_bits,0x10,0x10);
    Am_Image_Array::Am_Image_Array(local_78,(Am_Image_Array *)&my_diamond_fill);
    uVar2 = 0;
    Am_Style::Am_Style(local_70,"red",8,1,0,1,&Am_DEFAULT_DASH_LIST,2,2,0,local_78);
    Am_Image_Array::~Am_Image_Array(local_78);
    (**(code **)(*(long *)pAVar1 + 0x160))
              (pAVar1,&Am_Black,local_70,n + 0x1e,local_28,0x19,CONCAT44(uVar2,0x19),0);
    Am_Style::~Am_Style(local_70);
    Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&my_diamond_fill);
  }
  return;
}

Assistant:

void
testpercents(wins *wins_ar, int ar_len)
{
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *d = wins_ar[i].d2;

    int final_left = 0;
    int final_top = 0;

    for (int n = 0; n < 100; n = n + 6) {
      Am_Image_Array image_array(n);
      Am_Style image_style("red", 8, Am_CAP_BUTT, Am_JOIN_MITER,
                           Am_LINE_ON_OFF_DASH, Am_DEFAULT_DASH_LIST,
                           Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_STIPPLED,
                           Am_FILL_POLY_EVEN_ODD, image_array);
      int left = 10 + (((n / 6) % 3) * 30);
      int top = 8 + (((n / 6) / 3) * 29);
      d->Draw_Rectangle(Am_No_Style, image_style, left, top, 25, 25);
      final_left = left;
      final_top = top;
    }

    /*
    static char my_diamond_bits[] = {
        0x80, 0x00, 0xc0, 0x01, 0xe0, 0x03, 0xf0, 0x07, 0xf8, 0x0f, 0xfc, 0x1f,
        0xfe, 0x3f, 0xff, 0x7f, 0xfe, 0x3f, 0xfc, 0x1f, 0xf8, 0x0f, 0xf0, 0x07,
        0xe0, 0x03, 0xc0, 0x01, 0x80, 0x00, 0x00, 0x00};
*/
    static char my_diamond_bits[] = {
        '\200', '\0',  '\300', '\1',  '\340', '\3',  '\360', '\7',
        '\370', '\17', '\374', '\37', '\376', '\77', '\377', '\177',
        '\376', '\77', '\374', '\37', '\370', '\17', '\360', '\7',
        '\340', '\3',  '\300', '\1',  '\200', '\0',  '\0',   '\0'};

    // Style from image array

    Am_Image_Array my_diamond_image(my_diamond_bits, 16, 16);
    Am_Style my_diamond_fill("red", 8, Am_CAP_BUTT, Am_JOIN_MITER,
                             Am_LINE_ON_OFF_DASH, Am_DEFAULT_DASH_LIST,
                             Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_STIPPLED,
                             Am_FILL_POLY_EVEN_ODD, my_diamond_image);

    d->Draw_Rectangle(Am_Black, my_diamond_fill, final_left + 30, final_top, 25,
                      25);
  }
}